

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Own<kj::ReadableFile,_std::nullptr_t> __thiscall kj::newDiskReadableFile(kj *this,OwnFd *fd)

{
  ReadableFile *extraout_RDX;
  Own<kj::ReadableFile,_std::nullptr_t> OVar1;
  Own<kj::(anonymous_namespace)::DiskReadableFile,_std::nullptr_t> local_28;
  
  heap<kj::(anonymous_namespace)::DiskReadableFile,kj::OwnFd>((kj *)&local_28,fd);
  *(Disposer **)this = local_28.disposer;
  *(DiskReadableFile **)(this + 8) = local_28.ptr;
  local_28.ptr = (DiskReadableFile *)0x0;
  Own<kj::(anonymous_namespace)::DiskReadableFile,_std::nullptr_t>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<ReadableFile> newDiskReadableFile(kj::OwnFd fd) {
  return heap<DiskReadableFile>(kj::mv(fd));
}